

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::advance_setup
          (NavierStokesBase *this,Real param_1,Real dt,int iteration,int ncycle)

{
  int iVar1;
  element_type *peVar2;
  FabArray<amrex::FArrayBox> *pFVar3;
  pointer pSVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  FluxRegister *pFVar8;
  undefined8 *puVar9;
  BoxArray *pBVar10;
  MultiFab *pMVar11;
  long lVar12;
  int dir;
  long lVar13;
  int k;
  MFInfo local_60;
  Real local_38;
  
  iVar1 = *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.super_AmrInfo.
                   field_0x8c;
  local_38 = dt;
  bVar6 = std::operator==(&advection_scheme_abi_cxx11_,"MOL");
  this->umac_n_grow = (uint)!bVar6;
  MacProj::setup(mac_projector,(this->super_AmrLevel).level);
  if ((this->super_AmrLevel).level < iVar1) {
    bVar6 = std::operator==(&redistribution_type_abi_cxx11_,"StateRedist");
    if (bVar6) {
      iVar7 = nghost_state(this);
    }
    else {
      iVar7 = 1;
    }
    peVar2 = (this->Vsync).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_ref.
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        *(pointer *)
         ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      local_60.alloc = true;
      local_60._1_7_ = 0;
      local_60.arena = (Arena *)0x0;
      local_60.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_60.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_60.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      amrex::MultiFab::define
                (&this->Vsync,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,3,iVar7,
                 &local_60,
                 (this->super_AmrLevel).m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    }
    peVar2 = (this->Ssync).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_ref.
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        *(pointer *)
         ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      local_60.alloc = true;
      local_60._1_7_ = 0;
      local_60.arena = (Arena *)0x0;
      local_60.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_60.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_60.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      amrex::MultiFab::define
                (&this->Ssync,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,
                 NUM_STATE + -3,iVar7,&local_60,
                 (this->super_AmrLevel).m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    }
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&(this->Vsync).super_FabArray<amrex::FArrayBox>,0.0);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&(this->Ssync).super_FabArray<amrex::FArrayBox>,0.0);
  }
  if ((do_reflux != 0) && (iVar7 = (this->super_AmrLevel).level, iVar7 < iVar1)) {
    pFVar8 = getAdvFluxReg(this,iVar7 + 1);
    amrex::BndryRegister::setVal(&pFVar8->super_BndryRegister,0.0);
    pFVar8 = getViscFluxReg(this,(this->super_AmrLevel).level + 1);
    amrex::BndryRegister::setVal(&pFVar8->super_BndryRegister,0.0);
  }
  pMVar11 = this->u_mac;
  if (pMVar11 != (MultiFab *)0x0) {
    if (this->umac_n_grow <=
        (pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0])
    goto LAB_00326713;
    pFVar3 = pMVar11[-1].super_FabArray<amrex::FArrayBox>.os_temp._M_t.
             super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
    if (pFVar3 != (FabArray<amrex::FArrayBox> *)0x0) {
      lVar12 = (long)pFVar3 * 0x180;
      do {
        amrex::MultiFab::~MultiFab
                  ((MultiFab *)
                   ((long)&pMVar11[-1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                           _vptr_FabArrayBase + lVar12));
        lVar12 = lVar12 + -0x180;
      } while (lVar12 != 0);
    }
    operator_delete__(&pMVar11[-1].super_FabArray<amrex::FArrayBox>.os_temp,(long)pFVar3 * 0x180 | 8
                     );
  }
  puVar9 = (undefined8 *)operator_new__(0x488);
  *puVar9 = 3;
  lVar12 = 8;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)((long)puVar9 + lVar12));
    lVar12 = lVar12 + 0x180;
  } while (lVar12 != 0x488);
  this->u_mac = (MultiFab *)(puVar9 + 1);
  lVar12 = 0;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    pBVar10 = amrex::AmrLevel::getEdgeBoxArray(&this->super_AmrLevel,(int)lVar13);
    local_60.alloc = true;
    local_60._1_7_ = 0;
    local_60.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60.arena = (Arena *)0x0;
    local_60.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (**(code **)(*(long *)((long)&(this->u_mac->super_FabArray<amrex::FArrayBox>).super_FabArrayBase
                                  ._vptr_FabArrayBase + lVar12) + 0x10))
              ((long)&(this->u_mac->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                      _vptr_FabArrayBase + lVar12,pBVar10,&(this->super_AmrLevel).dmap,1,
               this->umac_n_grow,&local_60,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               ((long)&(this->u_mac->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                       _vptr_FabArrayBase + lVar12),1e+40);
    lVar12 = lVar12 + 0x180;
  }
LAB_00326713:
  pMVar11 = (MultiFab *)operator_new(0x180);
  local_60.alloc = true;
  local_60._1_7_ = 0;
  local_60.arena = (Arena *)0x0;
  local_60.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (pMVar11,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,NUM_STATE,0,
             &local_60,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  this->aofs = pMVar11;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if (((initial_step == 0) && (iteration == 1)) && (0 < (this->super_AmrLevel).level)) {
    initRhoAvg(this,0.5 / (double)ncycle);
  }
  lVar12 = 0;
  for (lVar13 = 0; lVar13 < num_state_type; lVar13 = lVar13 + 1) {
    pSVar4 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = *(long *)((long)&(pSVar4->old_data)._M_t + lVar12);
    amrex::StateData::allocOldData((StateData *)((long)&(pSVar4->domain).smallend + lVar12 + -0x10))
    ;
    if (lVar5 == 0) {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (*(FabArray<amrex::FArrayBox> **)
                  ((long)&(((this->super_AmrLevel).state.
                            super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                            super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                            _M_impl.super__Vector_impl_data._M_start)->old_data)._M_t + lVar12),0.0)
      ;
    }
    amrex::StateData::swapTimeLevels
              ((StateData *)
               ((long)&(((this->super_AmrLevel).state.
                         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         _M_impl.super__Vector_impl_data._M_start)->domain).smallend +
               lVar12 + -0x10),local_38);
    lVar12 = lVar12 + 0xe0;
  }
  make_rho_prev_time(this);
  return;
}

Assistant:

void
NavierStokesBase::advance_setup (Real /*time*/,
                                 Real dt,
                                 int  iteration,
                                 int  ncycle)
{
    BL_PROFILE("NavierStokesBase::advance_setup()");

    const int finest_level = parent->finestLevel();

    // Same for EB vs not.
    umac_n_grow = (advection_scheme == "MOL") ? 0 : 1;

#ifdef AMREX_PARTICLES
    if (ncycle > umac_n_grow) {
        umac_n_grow = ncycle;
    }
#endif

    mac_projector->setup(level);
    //
    // Why are they defined here versus the constructor?
    //
    if (level < finest_level)
    {
#ifdef AMREX_USE_EB
        int ng_sync = (redistribution_type == "StateRedist") ? nghost_state() : 1;
#else
        int ng_sync = 1;
#endif

        if (Vsync.empty()) {
            Vsync.define(grids,dmap,AMREX_SPACEDIM,ng_sync,MFInfo(),Factory());
        }
        if (Ssync.empty()) {
            Ssync.define(grids,dmap,NUM_STATE-AMREX_SPACEDIM,ng_sync,MFInfo(),Factory());
        }
        Vsync.setVal(0);
        Ssync.setVal(0);
    }
    //
    // Set reflux registers to zero.
    //
    if (do_reflux && level < finest_level)
    {
        getAdvFluxReg(level+1).setVal(0);
        getViscFluxReg(level+1).setVal(0);
    }
    //
    // Alloc space for edge velocities (normal comp only).
    //
    if (u_mac == 0 || u_mac[0].nGrow() < umac_n_grow)
    {
        if (u_mac != 0) {
            delete [] u_mac;
        }

        u_mac = new MultiFab[AMREX_SPACEDIM];

        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
        {
            const BoxArray& edgeba = getEdgeBoxArray(dir);
            u_mac[dir].define(edgeba,dmap,1,umac_n_grow,MFInfo(),Factory());
            u_mac[dir].setVal(1.e40);
        }
    }
    //
    // Alloc MultiFab to hold advective update terms.
    //
    AMREX_ASSERT(aofs == 0);
    aofs = new MultiFab(grids,dmap,NUM_STATE,0,MFInfo(),Factory());

    //
    // Set rho_avg.
    //
    if (!initial_step && level > 0 && iteration == 1) {
        initRhoAvg(0.5/Real(ncycle));
    }
    //
    // Set up state multifabs for the advance.
    //
    for (int k = 0; k < num_state_type; k++)
    {
        bool has_old_data = state[k].hasOldData();
        // does nothing if old_data!=null
        state[k].allocOldData();
        if (! has_old_data) {
            state[k].oldData().setVal(0.0);
        }
        // swaps pointers-- reuses space, but doesn't leave new with good data.
        state[k].swapTimeLevels(dt);
    }

    make_rho_prev_time();

    // refRatio==4 is not currently supported
    //
    // If refRatio==4 to the next level coarser, and we're going to diffuse
    // scalars as SoverRho, we're going to need rho at 1/4 and 3/4 time there.
    // Make these things if need be.
    //
    // if (level > 0)
    // {
    //     bool needs_rho4 = false;

    //     if (parent->nCycle(level) == 4)
    //         for (int i = 0; i < NUM_STATE && !needs_rho4; ++i)
    //             needs_rho4 = (diffusionType[i] == Laplacian_SoverRho);

    //     if (needs_rho4)
    //     {
    //         NavierStokesBase& clevel = getLevel(level-1);
    //         const BoxArray& cgrids = clevel.boxArray();
    //         const DistributionMapping& cdmap = clevel.DistributionMap();
    //         const Real      ptime  = clevel.state[State_Type].prevTime();
    //         const Real      ctime  = clevel.state[State_Type].curTime();

    //         if (clevel.rho_qtime == 0)
    //         {
    //             const Real qtime = ptime + 0.25*(ctime-ptime);
    //             clevel.rho_qtime = new MultiFab(cgrids,cdmap,1,1);
    //             FillPatch(clevel,*(clevel.rho_qtime),1,qtime,State_Type,Density,1,0);
    //         }
    //         if (clevel.rho_tqtime == 0)
    //         {
    //             const Real tqtime = ptime + 0.75*(ctime-ptime);
    //             clevel.rho_tqtime = new MultiFab(cgrids,cdmap,1,1);
    // 		FillPatch(clevel, *(clevel.rho_tqtime), 1, tqtime, State_Type, Density, 1, 0);
    //         }
    //    }
    // }
}